

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int ssa_dead_insn_p(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  MIR_insn_t_conflict insn;
  int iVar1;
  uint uVar2;
  size_t nop;
  ulong uVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  int local_4c;
  MIR_op_t *local_48;
  bb_insn_t_conflict local_40;
  undefined1 *local_38;
  
  insn = bb_insn->insn;
  iVar4 = (int)*(ulong *)&insn->field_0x18;
  if ((((iVar4 - 0xaaU < 0xfffffffd) &&
       ((uVar2 = iVar4 - 0xad, 5 < uVar2 || ((0x2bU >> (uVar2 & 0x1f) & 1) == 0)))) &&
      ((uVar3 = *(ulong *)&insn->field_0x18 >> 0x20, uVar3 == 0 ||
       ((insn->ops[0].field_0x8 != '\x02' || ((insn->ops[0].u.reg & 0xfffffffe) != 4)))))) &&
     (bb_insn->bb->index != 0)) {
    local_48 = insn->ops;
    local_38 = &insn->ops[0].field_0x8;
    nop = 0;
    iVar4 = 0;
    local_40 = bb_insn;
    do {
      if (uVar3 <= nop) {
LAB_00167f4e:
        if (*(int *)&insn->field_0x18 - 0x76U < 0xfffffff8) {
          return iVar4;
        }
        iVar1 = reachable_bo_exists_p((local_40->bb_insn_link).next);
        if (iVar1 != 0) {
          return 0;
        }
        return iVar4;
      }
      lVar5 = nop << 0x20;
      pcVar6 = local_38 + nop * 0x30;
      while ((MIR_insn_op_mode(gen_ctx->ctx,insn,nop,&local_4c), local_4c == 0 || (*pcVar6 == '\v'))
            ) {
        nop = nop + 1;
        pcVar6 = pcVar6 + 0x30;
        lVar5 = lVar5 + 0x100000000;
        if (uVar3 == nop) goto LAB_00167f4e;
      }
      if (*pcVar6 != '\x02') {
        __assert_fail("op_ref->mode == MIR_OP_VAR",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x4ff,
                      "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                     );
      }
      if (local_48[lVar5 >> 0x20].field_0x8 == '\v') {
        return 0;
      }
      nop = nop + 1;
      iVar4 = 1;
    } while (local_48[lVar5 >> 0x20].data == (void *)0x0);
  }
  return 0;
}

Assistant:

static int ssa_dead_insn_p (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  MIR_insn_t insn = bb_insn->insn;
  int op_num, output_exists_p = FALSE;
  MIR_reg_t var;
  insn_var_iterator_t iter;
  ssa_edge_t ssa_edge;

  /* check control insns with possible output: */
  if (MIR_call_code_p (insn->code) || insn->code == MIR_ALLOCA || insn->code == MIR_BSTART
      || insn->code == MIR_VA_START || insn->code == MIR_VA_ARG
      || (insn->nops > 0 && insn->ops[0].mode == MIR_OP_VAR
          && (insn->ops[0].u.var == FP_HARD_REG || insn->ops[0].u.var == SP_HARD_REG)))
    return FALSE;
  if (fake_insn_p (bb_insn)) return FALSE;
  FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
    output_exists_p = TRUE;
    if (insn->ops[op_num].mode == MIR_OP_VAR_MEM || (ssa_edge = insn->ops[op_num].data) != NULL)
      return FALSE;
  }
  if (!MIR_overflow_insn_code_p (insn->code)
      || !reachable_bo_exists_p (DLIST_NEXT (bb_insn_t, bb_insn)))
    return output_exists_p;
  return FALSE;
}